

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::DebuggerScope::Dump(DebuggerScope *this)

{
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  DebuggerScopeProperty *pDVar2;
  int iVar3;
  int iVar4;
  PCWSTR pWVar5;
  ThreadContext *this_00;
  PropertyRecord *pPVar6;
  DebuggerScope *this_01;
  char16_t *pcVar7;
  long lVar8;
  int i;
  long lVar9;
  
  this_01 = this;
  iVar3 = GetScopeDepth(this);
  iVar3 = iVar3 * 4 + -4;
  pWVar5 = GetDebuggerScopeTypeString(this_01,this->scopeType);
  Output::Print(iVar3,
                L"Begin scope: Address: %p Type: %s Location: %d Sibling: %p Range: [%d, %d]\n ",
                this,pWVar5,(ulong)this->scopeLocation,(this->siblingScope).ptr,
                (ulong)(uint)(this->range).begin,(ulong)(uint)(this->range).end);
  pLVar1 = (this->scopeProperties).ptr;
  if ((pLVar1 != (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0) &&
     (iVar4 = (pLVar1->
              super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
              count, 0 < iVar4)) {
    lVar8 = 0;
    for (lVar9 = 0; lVar9 < iVar4; lVar9 = lVar9 + 1) {
      pDVar2 = (pLVar1->
               super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
               buffer.ptr;
      this_00 = ThreadContext::GetContextForCurrentThread();
      pPVar6 = ThreadContext::GetPropertyName
                         (this_00,*(PropertyId *)((long)&pDVar2->propId + lVar8));
      pcVar7 = L"true";
      if ((*(byte *)((long)&pDVar2->flags + lVar8) & 1) == 0) {
        pcVar7 = L"false";
      }
      Output::Print(iVar3,L"%s(%d) Location: %d Const: %s Initialized: %d\n",pPVar6 + 1,
                    (ulong)*(uint *)((long)&pDVar2->propId + lVar8),
                    (ulong)*(uint *)((long)&pDVar2->location + lVar8),pcVar7,
                    (ulong)*(uint *)((long)&pDVar2->byteCodeInitializationOffset + lVar8));
      iVar4 = (pLVar1->
              super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
              count;
      lVar8 = lVar8 + 0x10;
    }
  }
  Output::Print(L"\n");
  return;
}

Assistant:

void DebuggerScope::Dump()
    {
        int indent = (GetScopeDepth() - 1) * 4;

        Output::Print(indent, _u("Begin scope: Address: %p Type: %s Location: %d Sibling: %p Range: [%d, %d]\n "), this, GetDebuggerScopeTypeString(scopeType), scopeLocation, PointerValue(this->siblingScope), range.begin, range.end);
        if (this->HasProperties())
        {
            this->scopeProperties->Map( [=] (int i, Js::DebuggerScopeProperty& scopeProperty) {
                Output::Print(indent, _u("%s(%d) Location: %d Const: %s Initialized: %d\n"), ThreadContext::GetContextForCurrentThread()->GetPropertyName(scopeProperty.propId)->GetBuffer(),
                    scopeProperty.propId, scopeProperty.location, scopeProperty.IsConst() ? _u("true"): _u("false"), scopeProperty.byteCodeInitializationOffset);
            });
        }

        Output::Print(_u("\n"));
    }